

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int mj_read_file(uchar **buffer,size_t *len,char *filename)

{
  int __fd;
  void *pvVar1;
  size_t sVar2;
  char *in_RDX;
  size_t *in_RSI;
  long *in_RDI;
  size_t b;
  stat s;
  FILE *fp;
  stat local_b8;
  FILE *local_28;
  size_t *local_18;
  long *local_10;
  int local_4;
  
  if (in_RDX == (char *)0x0) {
    local_4 = 2;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_28 = fopen(in_RDX,"rb");
    if (local_28 == (FILE *)0x0) {
      local_4 = 7;
    }
    else {
      __fd = fileno(local_28);
      fstat(__fd,&local_b8);
      *local_18 = local_b8.st_size;
      pvVar1 = calloc(*local_18 + 1,1);
      *local_10 = (long)pvVar1;
      if (*local_10 == 0) {
        *local_18 = 0;
        local_4 = 1;
      }
      else {
        sVar2 = fread((void *)*local_10,1,*local_18,local_28);
        fclose(local_28);
        if (sVar2 == *local_18) {
          local_4 = 0;
        }
        else {
          free((void *)*local_10);
          *local_18 = 0;
          local_4 = 7;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int mj_read_file(unsigned char **buffer, size_t *len, const char *filename) {
    if(filename == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    FILE *      fp;
    struct stat s;

    fp = fopen(filename, "rb");
    if(fp == NULL) {
        return MJ_ERR_FILEIO;
    }

    fstat(fileno(fp), &s);

    *len = (size_t)s.st_size;

    *buffer = (unsigned char *)calloc(*len + 1, sizeof(unsigned char));
    if(*buffer == NULL) {
        *len = 0;

        return MJ_ERR_MEMORY;
    }

    size_t b;
    b = fread(*buffer, 1, *len, fp);

    fclose(fp);

    if(b != *len) {
        free(*buffer);
        *len = 0;

        return MJ_ERR_FILEIO;
    }

    return MJ_OK;
}